

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O2

int If_LogCounterAddAig(int *pTimes,int *pnTimes,int *pFaninLits,int Num,int iLit,Vec_Int_t *vAig,
                       int nSuppAll,int fXor,int fXorFunc)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar1 = *pnTimes;
  uVar6 = (ulong)uVar1;
  if (vAig != (Vec_Int_t *)0x0) {
    pFaninLits[(int)uVar1] = iLit;
  }
  iVar5 = uVar1 + 1;
  pTimes[(int)uVar1] = Num;
  if (0 < (int)uVar1) {
    while (iVar4 = (int)uVar6, 0 < iVar4) {
      iVar2 = pTimes[uVar6];
      uVar9 = (ulong)(iVar4 - 1);
      iVar3 = pTimes[uVar9];
      if (iVar2 < iVar3) break;
      if (iVar3 < iVar2) {
        pTimes[uVar6] = iVar3;
        pTimes[uVar9] = iVar2;
        if (vAig != (Vec_Int_t *)0x0) {
          iVar2 = pFaninLits[uVar6];
          pFaninLits[uVar6] = pFaninLits[uVar9];
          pFaninLits[uVar9] = iVar2;
        }
        uVar6 = (ulong)(iVar4 - 1);
      }
      else {
        pTimes[uVar9] = iVar3 + 1;
        if (vAig != (Vec_Int_t *)0x0) {
          iVar4 = If_LogCreateAndXor(vAig,pFaninLits[uVar6],pFaninLits[uVar9],nSuppAll,iLit);
          pFaninLits[uVar9] = iVar4;
        }
        iVar5 = iVar5 + -1;
        uVar8 = uVar6;
        while( true ) {
          uVar7 = uVar8 + 1;
          iVar4 = (int)uVar6;
          uVar6 = uVar9;
          if (iVar5 <= iVar4) break;
          pTimes[uVar8] = pTimes[uVar7];
          if (vAig != (Vec_Int_t *)0x0) {
            pFaninLits[uVar8] = pFaninLits[uVar7];
          }
          uVar6 = (ulong)(iVar4 + 1);
          uVar8 = uVar7;
        }
      }
    }
  }
  if (iVar5 < 1) {
    __assert_fail("nTimes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCount.h"
                  ,0x77,
                  "int If_LogCounterAddAig(int *, int *, int *, int, int, Vec_Int_t *, int, int, int)"
                 );
  }
  *pnTimes = iVar5;
  return (uint)(iVar5 != 1) + *pTimes;
}

Assistant:

static inline int If_LogCounterAddAig( int * pTimes, int * pnTimes, int * pFaninLits, int Num, int iLit, Vec_Int_t * vAig, int nSuppAll, int fXor, int fXorFunc )
{
    int nTimes = *pnTimes;
    if ( vAig )
        pFaninLits[nTimes] = iLit;
    pTimes[nTimes++] = Num;
    if ( nTimes > 1 )
    {
        int i, k;
        for ( k = nTimes-1; k > 0; k-- )
        {
            if ( pTimes[k] < pTimes[k-1] )
                break;
            if ( pTimes[k] > pTimes[k-1] )
            { 
                ABC_SWAP( int, pTimes[k], pTimes[k-1] ); 
                if ( vAig )
                    ABC_SWAP( int, pFaninLits[k], pFaninLits[k-1] ); 
                continue; 
            }
            pTimes[k-1] += 1 + fXor;
            if ( vAig )
                pFaninLits[k-1] = If_LogCreateAndXor( vAig, pFaninLits[k], pFaninLits[k-1], nSuppAll, fXorFunc );
            for ( nTimes--, i = k; i < nTimes; i++ )
            {
                pTimes[i] = pTimes[i+1];
                if ( vAig )
                    pFaninLits[i] = pFaninLits[i+1];
            }
        }
    }
    assert( nTimes > 0 );
    *pnTimes = nTimes;
    return pTimes[0] + (nTimes > 1 ? 1 + fXor : 0);
}